

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall imrt::Collimator::printReference(Collimator *this)

{
  undefined8 in_RAX;
  ostream *poVar1;
  mapped_type *pmVar2;
  int iVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  poVar1 = std::operator<<((ostream *)&std::cout,"Reference list");
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar3 = 0;
  while (uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38), iVar3 < this->ref_size) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    poVar1 = std::operator<<(poVar1," ");
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](&this->reference,(key_type_conflict *)((long)&uStack_38 + 4));
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pmVar2->first);
    poVar1 = std::operator<<(poVar1,",");
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](&this->reference,(key_type_conflict *)((long)&uStack_38 + 4));
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pmVar2->second);
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar3 = uStack_38._4_4_ + 1;
  }
  return;
}

Assistant:

void Collimator::printReference () {
    cout << "Reference list" << endl;
    for (int i=0; i < ref_size; i++) {
      cout << i << " " << reference[i].first << "," << reference[i].second << endl;
    }
  }